

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# em_full_vars.c
# Opt level: O2

float Expectation(float *Tau,float *x,float *c,float **mean,float **hafinvvar,float *corprod,int K,
                 int Ndim)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  float local_48;
  
  local_48 = gauss(x,*mean,*hafinvvar,*corprod,Ndim);
  *Tau = local_48;
  for (lVar3 = 1; lVar3 < K; lVar3 = lVar3 + 1) {
    fVar4 = gauss(x,mean[lVar3],hafinvvar[lVar3],corprod[lVar3],Ndim);
    Tau[lVar3] = fVar4;
    if (fVar4 <= local_48) {
      fVar4 = local_48;
    }
    local_48 = fVar4;
  }
  uVar2 = 0;
  uVar1 = (ulong)(uint)K;
  if (K < 1) {
    uVar1 = uVar2;
  }
  fVar4 = 0.0;
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    fVar5 = 0.0;
    if (local_48 + -22.0 < Tau[uVar2]) {
      dVar6 = exp((double)((Tau[uVar2] - local_48) + 10.0));
      fVar5 = (float)dVar6;
      fVar4 = fVar4 + fVar5;
    }
    Tau[uVar2] = fVar5;
  }
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    Tau[uVar2] = Tau[uVar2] * (1.0 / fVar4);
  }
  dVar6 = log((double)fVar4);
  return (float)(dVar6 + (double)local_48 + -10.0);
}

Assistant:

float Expectation(float *Tau,	/* Mode probablity of observation vector x */
		  float *x,	/* Observation vector x */
		  float *c,	/* Mixing proportions of modes */
		  float **mean,	/* Means of the modes */
		  float **hafinvvar,	/* 1.0/(2.0*variance) of the modes */
		  float *corprod,	/* Precomputed 1/sqrt(2PI**Ndim * mod(variance)) */
		  int K,	/* Number of modes */
		  int Ndim	/* Dimensionality of observation/distribution */
    )
{
	float Probability, max, sum, invsum;

	int i;


	Tau[0] = max = gauss(x, mean[0], hafinvvar[0], corprod[0], Ndim);
	for (i = 1; i < K; ++i) {
		/*
		 * Note: prior c[i] has already been factored into corprod
		 */
		Tau[i] = gauss(x, mean[i], hafinvvar[i], corprod[i], Ndim);
		if (Tau[i] > max)
			max = Tau[i];
	}

	/* convert Tau from log to linear */
	sum = 0.0;
	for (i = 0; i < K; ++i) {
		if (Tau[i] > max - 22) {	/* only consider probs within 10^10 of max */
			Tau[i] = exp(Tau[i] - max + 10);
			sum += Tau[i];
		} else
			Tau[i] = 0;
	}
	invsum = 1.0 / sum;
	for (i = 0; i < K; ++i)
		Tau[i] *= invsum;

	Probability = max + log(sum) - 10;
	return (Probability);
}